

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall
dgMeshEffect::dgMeshEffect
          (dgMeshEffect *this,HaF64 *vertexCloud,HaI32 count,HaI32 strideInByte,HaF64 distTol)

{
  dgListNode *pdVar1;
  dgVector *vertex;
  dgBigVector *copy;
  int *piVar2;
  int *faceIndexCount;
  int *vertexIndex;
  dgListNode **ppdVar3;
  int *piVar4;
  int *uv0Index;
  int *uv1Index;
  dgVector *pdVar5;
  ulong uVar6;
  dgStack<int> normalIndexListPool;
  dgStack<int> materialsPool;
  dgStack<int> vertexIndexListPool;
  dgStack<int> faceCountPool;
  dgTemplateVector<float> local_a8;
  dgStack<dgVector> pointsPool;
  HaF32 local_88 [4];
  dgConvexHull3d convexHull;
  
  dgPolyhedra::dgPolyhedra(&this->super_dgPolyhedra);
  (this->super_dgRefCounter).m_refCount = 1;
  (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>._vptr_dgTree =
       (_func_int **)&PTR__dgMeshEffect_0118ebe8;
  (this->super_dgRefCounter)._vptr_dgRefCounter = (_func_int **)&PTR__dgMeshEffect_0118ec08;
  Init(this,true);
  if (3 < count) {
    dgConvexHull3d::dgConvexHull3d(&convexHull,vertexCloud,strideInByte,count,distTol,0x7fffffff);
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count != 0) {
      dgStack<dgVector>::dgStack(&pointsPool,convexHull.m_count);
      vertex = dgStack<dgVector>::operator[](&pointsPool,0);
      pdVar5 = vertex;
      for (uVar6 = 0; (uint)(~(convexHull.m_count >> 0x1f) & convexHull.m_count) != uVar6;
          uVar6 = uVar6 + 1) {
        copy = dgArray<dgBigVector>::operator[](&convexHull.m_points,(HaI32)uVar6);
        dgVector::dgVector((dgVector *)&local_a8,copy);
        (pdVar5->super_dgTemplateVector<float>).m_x = local_a8.m_x;
        (pdVar5->super_dgTemplateVector<float>).m_y = local_a8.m_y;
        (pdVar5->super_dgTemplateVector<float>).m_z = local_a8.m_z;
        (pdVar5->super_dgTemplateVector<float>).m_w = local_a8.m_w;
        pdVar5 = pdVar5 + 1;
      }
      local_a8.m_x = 0.0;
      local_a8.m_y = 0.0;
      local_a8.m_z = 0.0;
      local_a8.m_w = 0.0;
      local_88[0] = 0.0;
      local_88[1] = 1.0;
      local_88[2] = 0.0;
      local_88[3] = 0.0;
      dgStack<int>::dgStack(&faceCountPool,convexHull.super_dgList<dgConvexHull3DFace>.m_count);
      dgStack<int>::dgStack(&materialsPool,convexHull.super_dgList<dgConvexHull3DFace>.m_count);
      dgStack<int>::dgStack
                (&vertexIndexListPool,convexHull.super_dgList<dgConvexHull3DFace>.m_count * 3);
      dgStack<int>::dgStack
                (&normalIndexListPool,convexHull.super_dgList<dgConvexHull3DFace>.m_count * 3);
      piVar2 = dgStack<int>::operator[](&materialsPool,0);
      memset(piVar2,0,(long)convexHull.super_dgList<dgConvexHull3DFace>.m_count << 2);
      piVar2 = dgStack<int>::operator[](&normalIndexListPool,0);
      memset(piVar2,0,(long)convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc);
      faceIndexCount = dgStack<int>::operator[](&faceCountPool,0);
      vertexIndex = dgStack<int>::operator[](&vertexIndexListPool,0);
      piVar4 = vertexIndex + 2;
      ppdVar3 = &convexHull.super_dgList<dgConvexHull3DFace>.m_first;
      piVar2 = faceIndexCount;
      while (pdVar1 = *ppdVar3, pdVar1 != (dgListNode *)0x0) {
        *piVar2 = 3;
        piVar2 = piVar2 + 1;
        piVar4[-2] = (pdVar1->m_info).m_index[0];
        piVar4[-1] = (pdVar1->m_info).m_index[1];
        *piVar4 = (pdVar1->m_info).m_index[2];
        piVar4 = piVar4 + 3;
        ppdVar3 = &pdVar1->m_next;
      }
      piVar2 = dgStack<int>::operator[](&materialsPool,0);
      piVar4 = dgStack<int>::operator[](&normalIndexListPool,0);
      uv0Index = dgStack<int>::operator[](&normalIndexListPool,0);
      uv1Index = dgStack<int>::operator[](&normalIndexListPool,0);
      BuildFromVertexListIndexList
                (this,convexHull.super_dgList<dgConvexHull3DFace>.m_count,faceIndexCount,piVar2,
                 (HaF32 *)vertex,0x10,vertexIndex,local_88,0x10,piVar4,(HaF32 *)&local_a8,0x10,
                 uv0Index,(HaF32 *)&local_a8,0x10,uv1Index);
      free(normalIndexListPool.super_dgStackBase.m_ptr);
      free(vertexIndexListPool.super_dgStackBase.m_ptr);
      free(materialsPool.super_dgStackBase.m_ptr);
      free(faceCountPool.super_dgStackBase.m_ptr);
      free(pointsPool.super_dgStackBase.m_ptr);
    }
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  return;
}

Assistant:

dgMeshEffect::dgMeshEffect (const hacd::HaF64* const vertexCloud, hacd::HaI32 count, hacd::HaI32 strideInByte, hacd::HaF64 distTol)
:dgPolyhedra()
{
	Init(true);
	if (count >= 4) {
		dgConvexHull3d convexHull (vertexCloud, strideInByte, count, distTol);
		if (convexHull.GetCount()) {

			hacd::HaI32 vertexCount = convexHull.GetVertexCount();
			dgStack<dgVector> pointsPool (convexHull.GetVertexCount());
			dgVector* const points = &pointsPool[0];
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
				points[i] = convexHull.GetVertex(i);
			}
			dgVector uv(hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
			dgVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

			hacd::HaI32 triangleCount = convexHull.GetCount();
			dgStack<hacd::HaI32> faceCountPool (triangleCount);
			dgStack<hacd::HaI32> materialsPool (triangleCount);
			dgStack<hacd::HaI32> vertexIndexListPool (triangleCount * 3);
			dgStack<hacd::HaI32> normalIndexListPool (triangleCount * 3);


			memset (&materialsPool[0], 0, triangleCount * sizeof (hacd::HaI32));
			memset (&normalIndexListPool[0], 0, 3 * triangleCount * sizeof (hacd::HaI32));

			hacd::HaI32 index = 0;
			hacd::HaI32* const faceCount = &faceCountPool[0];
			hacd::HaI32* const vertexIndexList = &vertexIndexListPool[0];
			for (dgConvexHull3d::dgListNode* faceNode = convexHull.GetFirst(); faceNode; faceNode = faceNode->GetNext()) {
				dgConvexHull3DFace& face = faceNode->GetInfo();
				faceCount[index] = 3;
				vertexIndexList[index * 3 + 0] = face.m_index[0]; 
				vertexIndexList[index * 3 + 1] = face.m_index[1]; 
				vertexIndexList[index * 3 + 2] = face.m_index[2]; 
				index ++;
			}

			BuildFromVertexListIndexList(triangleCount, faceCount, &materialsPool[0], 
				&points[0].m_x, sizeof (dgVector), vertexIndexList,
				&normal.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0]);
		}
	}
}